

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O3

ENetHost *
enet_host_create(ENetAddress *address,size_t peerCount,size_t channelLimit,
                enet_uint32 incomingBandwidth,enet_uint32 outgoingBandwidth)

{
  ENetSocket socket;
  int iVar1;
  int iVar2;
  enet_uint32 eVar3;
  uint uVar4;
  ENetHost *__s;
  ENetPeer *pEVar5;
  ENetPeer *pEVar6;
  ENetPeer *pEVar7;
  long lVar8;
  size_t sVar9;
  
  if ((peerCount < 0x1000) && (__s = (ENetHost *)enet_malloc(0x2b10), __s != (ENetHost *)0x0)) {
    memset(__s,0,0x2b10);
    pEVar5 = (ENetPeer *)enet_malloc(peerCount * 0x1c8);
    __s->peers = pEVar5;
    if (pEVar5 != (ENetPeer *)0x0) {
      memset(pEVar5,0,peerCount * 0x1c8);
      socket = enet_socket_create(ENET_SOCKET_TYPE_DATAGRAM);
      __s->socket = socket;
      if (socket != -1) {
        if (address == (ENetAddress *)0x0) {
          enet_socket_set_option(socket,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_SNDBUF,0x40000);
LAB_0015e297:
          sVar9 = 0xff;
          if (0xffffffffffffff00 < channelLimit - 0x100) {
            sVar9 = channelLimit;
          }
          __s->randomSeed = (enet_uint32)__s;
          eVar3 = enet_host_random_seed();
          uVar4 = eVar3 + __s->randomSeed;
          __s->randomSeed = uVar4 * 0x10000 | uVar4 >> 0x10;
          __s->channelLimit = sVar9;
          __s->incomingBandwidth = incomingBandwidth;
          __s->outgoingBandwidth = outgoingBandwidth;
          __s->bandwidthThrottleEpoch = 0;
          __s->mtu = 0x578;
          __s->recalculateBandwidthLimits = 0;
          __s->peerCount = peerCount;
          __s->commandCount = 0;
          (__s->receivedAddress).host = 0;
          (__s->receivedAddress).port = 0;
          __s->bufferCount = 0;
          __s->checksum = (ENetChecksumCallback)0x0;
          __s->receivedData = (enet_uint8 *)0x0;
          __s->receivedDataLength = 0;
          __s->totalSentData = 0;
          __s->totalSentPackets = 0;
          __s->totalReceivedData = 0;
          __s->totalReceivedPackets = 0;
          __s->connectedPeers = 0;
          __s->bandwidthLimitedPeers = 0;
          __s->duplicatePeers = 0xfff;
          __s->maximumPacketSize = 0x2000000;
          __s->maximumWaitingData = 0x2000000;
          __s->intercept = (ENetInterceptCallback)0x0;
          (__s->compressor).context = (void *)0x0;
          (__s->compressor).compress =
               (_func_size_t_void_ptr_ENetBuffer_ptr_size_t_size_t_enet_uint8_ptr_size_t *)0x0;
          (__s->compressor).decompress =
               (_func_size_t_void_ptr_enet_uint8_ptr_size_t_enet_uint8_ptr_size_t *)0x0;
          (__s->compressor).destroy = (_func_void_void_ptr *)0x0;
          enet_list_clear(&__s->dispatchQueue);
          if ((long)__s->peerCount < 1) {
            return __s;
          }
          pEVar5 = __s->peers;
          lVar8 = 0;
          pEVar6 = pEVar5;
          do {
            pEVar7 = (ENetPeer *)((long)&(pEVar5->dispatchList).next + lVar8);
            *(ENetHost **)((long)&pEVar5->host + lVar8) = __s;
            *(short *)((long)&pEVar5->incomingPeerID + lVar8) =
                 (short)((uint)((int)pEVar7 - (int)pEVar6) >> 3) * -0x11f7;
            *(undefined2 *)(&pEVar5->outgoingSessionID + lVar8) = 0xffff;
            *(undefined8 *)((long)&pEVar5->data + lVar8) = 0;
            enet_list_clear((ENetList *)((long)pEVar5->unsequencedWindow + lVar8 + -0x58));
            enet_list_clear((ENetList *)((long)pEVar5->unsequencedWindow + lVar8 + -0x48));
            enet_list_clear((ENetList *)((long)pEVar5->unsequencedWindow + lVar8 + -0x38));
            enet_list_clear((ENetList *)((long)pEVar5->unsequencedWindow + lVar8 + -0x28));
            enet_list_clear((ENetList *)((long)pEVar5->unsequencedWindow + lVar8 + -0x18));
            enet_peer_reset(pEVar7);
            pEVar6 = __s->peers;
            pEVar7 = (ENetPeer *)((long)&pEVar5[1].dispatchList.next + lVar8);
            lVar8 = lVar8 + 0x1c8;
          } while (pEVar7 < pEVar6 + __s->peerCount);
          return __s;
        }
        iVar1 = enet_socket_bind(socket,address);
        iVar2 = __s->socket;
        if (-1 < iVar1) {
          enet_socket_set_option(iVar2,ENET_SOCKOPT_NONBLOCK,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_BROADCAST,1);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_RCVBUF,0x40000);
          enet_socket_set_option(__s->socket,ENET_SOCKOPT_SNDBUF,0x40000);
          iVar2 = enet_socket_get_address(__s->socket,&__s->address);
          if (iVar2 < 0) {
            __s->address = *address;
          }
          goto LAB_0015e297;
        }
        if (iVar2 != -1) {
          enet_socket_destroy(iVar2);
        }
      }
      enet_free(__s->peers);
    }
    enet_free(__s);
  }
  return (ENetHost *)0x0;
}

Assistant:

ENetHost *
enet_host_create (const ENetAddress * address, size_t peerCount, size_t channelLimit, enet_uint32 incomingBandwidth, enet_uint32 outgoingBandwidth)
{
    ENetHost * host;
    ENetPeer * currentPeer;

    if (peerCount > ENET_PROTOCOL_MAXIMUM_PEER_ID)
      return NULL;

    host = (ENetHost *) enet_malloc (sizeof (ENetHost));
    if (host == NULL)
      return NULL;
    memset (host, 0, sizeof (ENetHost));

    host -> peers = (ENetPeer *) enet_malloc (peerCount * sizeof (ENetPeer));
    if (host -> peers == NULL)
    {
       enet_free (host);

       return NULL;
    }
    memset (host -> peers, 0, peerCount * sizeof (ENetPeer));

    host -> socket = enet_socket_create (ENET_SOCKET_TYPE_DATAGRAM);
    if (host -> socket == ENET_SOCKET_NULL || (address != NULL && enet_socket_bind (host -> socket, address) < 0))
    {
       if (host -> socket != ENET_SOCKET_NULL)
         enet_socket_destroy (host -> socket);

       enet_free (host -> peers);
       enet_free (host);

       return NULL;
    }

    enet_socket_set_option (host -> socket, ENET_SOCKOPT_NONBLOCK, 1);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_BROADCAST, 1);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_RCVBUF, ENET_HOST_RECEIVE_BUFFER_SIZE);
    enet_socket_set_option (host -> socket, ENET_SOCKOPT_SNDBUF, ENET_HOST_SEND_BUFFER_SIZE);

    if (address != NULL && enet_socket_get_address (host -> socket, & host -> address) < 0)   
      host -> address = * address;

    if (! channelLimit || channelLimit > ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MAXIMUM_CHANNEL_COUNT;
    else
    if (channelLimit < ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT)
      channelLimit = ENET_PROTOCOL_MINIMUM_CHANNEL_COUNT;

    host -> randomSeed = (enet_uint32) (size_t) host;
    host -> randomSeed += enet_host_random_seed ();
    host -> randomSeed = (host -> randomSeed << 16) | (host -> randomSeed >> 16);
    host -> channelLimit = channelLimit;
    host -> incomingBandwidth = incomingBandwidth;
    host -> outgoingBandwidth = outgoingBandwidth;
    host -> bandwidthThrottleEpoch = 0;
    host -> recalculateBandwidthLimits = 0;
    host -> mtu = ENET_HOST_DEFAULT_MTU;
    host -> peerCount = peerCount;
    host -> commandCount = 0;
    host -> bufferCount = 0;
    host -> checksum = NULL;
    host -> receivedAddress.host = ENET_HOST_ANY;
    host -> receivedAddress.port = 0;
    host -> receivedData = NULL;
    host -> receivedDataLength = 0;
     
    host -> totalSentData = 0;
    host -> totalSentPackets = 0;
    host -> totalReceivedData = 0;
    host -> totalReceivedPackets = 0;

    host -> connectedPeers = 0;
    host -> bandwidthLimitedPeers = 0;
    host -> duplicatePeers = ENET_PROTOCOL_MAXIMUM_PEER_ID;
    host -> maximumPacketSize = ENET_HOST_DEFAULT_MAXIMUM_PACKET_SIZE;
    host -> maximumWaitingData = ENET_HOST_DEFAULT_MAXIMUM_WAITING_DATA;

    host -> compressor.context = NULL;
    host -> compressor.compress = NULL;
    host -> compressor.decompress = NULL;
    host -> compressor.destroy = NULL;

    host -> intercept = NULL;

    enet_list_clear (& host -> dispatchQueue);

    for (currentPeer = host -> peers;
         currentPeer < & host -> peers [host -> peerCount];
         ++ currentPeer)
    {
       currentPeer -> host = host;
       currentPeer -> incomingPeerID = currentPeer - host -> peers;
       currentPeer -> outgoingSessionID = currentPeer -> incomingSessionID = 0xFF;
       currentPeer -> data = NULL;

       enet_list_clear (& currentPeer -> acknowledgements);
       enet_list_clear (& currentPeer -> sentReliableCommands);
       enet_list_clear (& currentPeer -> sentUnreliableCommands);
       enet_list_clear (& currentPeer -> outgoingCommands);
       enet_list_clear (& currentPeer -> dispatchedCommands);

       enet_peer_reset (currentPeer);
    }

    return host;
}